

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volk.c
# Opt level: O0

uint32_t volkGetInstanceVersion(void)

{
  VkResult VVar1;
  ulong in_RAX;
  uint32_t apiVersion;
  undefined8 local_8;
  
  local_8 = in_RAX & 0xffffffff00000000;
  if ((vkEnumerateInstanceVersion != (PFN_vkEnumerateInstanceVersion)0x0) &&
     (VVar1 = (*vkEnumerateInstanceVersion)((uint32_t *)&local_8), VVar1 == VK_SUCCESS)) {
    local_8._4_4_ = (uint32_t)local_8;
    return local_8._4_4_;
  }
  if (vkCreateInstance == (PFN_vkCreateInstance)0x0) {
    local_8._4_4_ = 0;
  }
  else {
    local_8._4_4_ = 0x400000;
  }
  return local_8._4_4_;
}

Assistant:

uint32_t volkGetInstanceVersion(void)
{
#if defined(VK_VERSION_1_1)
	uint32_t apiVersion = 0;
	if (vkEnumerateInstanceVersion && vkEnumerateInstanceVersion(&apiVersion) == VK_SUCCESS)
		return apiVersion;
#endif

	if (vkCreateInstance)
		return VK_API_VERSION_1_0;

	return 0;
}